

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O1

void __thiscall ccs::BuildContext::addProperty(BuildContext *this,PropDef *propDef)

{
  uint propertyNumber;
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  Value value;
  undefined1 local_138 [40];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  Property local_d0;
  
  local_138._0_4_ = (propDef->value_).which_;
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::vector
            ((vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> *)(local_138 + 8),
             &(propDef->value_).rawStringVal_.elements_);
  local_138._32_8_ = (propDef->value_).rawPrimVal_;
  local_110._M_p = (pointer)&local_100;
  pcVar1 = (propDef->value_).strVal_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + (propDef->value_).strVal_._M_string_length);
  pcVar1 = (propDef->value_).name_._M_dataplus._M_p;
  local_f0._M_p = (pointer)&local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (propDef->value_).name_._M_string_length);
  std::__cxx11::string::_M_assign((string *)&local_f0);
  iVar2 = (*this->_vptr_BuildContext[2])(this);
  propertyNumber = this->dag_->nextProperty_;
  this->dag_->nextProperty_ = propertyNumber + 1;
  Property::Property(&local_d0,(Value *)local_138,&propDef->origin_,propertyNumber,
                     propDef->override_);
  Node::addProperty((Node *)CONCAT44(extraout_var,iVar2),&propDef->name_,&local_d0);
  local_d0.super_CcsProperty._vptr_CcsProperty = (_func_int **)&PTR__Property_0015bd30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.origin_.fileName._M_dataplus._M_p != &local_d0.origin_.fileName.field_2) {
    operator_delete(local_d0.origin_.fileName._M_dataplus._M_p,
                    local_d0.origin_.fileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.value_.name_._M_dataplus._M_p != &local_d0.value_.name_.field_2) {
    operator_delete(local_d0.value_.name_._M_dataplus._M_p,
                    local_d0.value_.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.value_.strVal_._M_dataplus._M_p != &local_d0.value_.strVal_.field_2) {
    operator_delete(local_d0.value_.strVal_._M_dataplus._M_p,
                    local_d0.value_.strVal_.field_2._M_allocated_capacity + 1);
  }
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector
            (&local_d0.value_.rawStringVal_.elements_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
  }
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector
            ((vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> *)(local_138 + 8));
  return;
}

Assistant:

void BuildContext::addProperty(const ast::PropDef &propDef) {
  Value value(propDef.value_);
  value.setName(propDef.name_);
  node().addProperty(propDef.name_, Property(value,
      propDef.origin_, dag_.nextProperty(), propDef.override_));
}